

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int updateMapping(Rtree *pRtree,i64 iRowid,RtreeNode *pNode,int iHeight)

{
  int iVar1;
  code *pcVar2;
  RtreeNode *pRVar3;
  RtreeNode *pChild;
  _func_int_Rtree_ptr_sqlite3_int64_sqlite3_int64 *xSetMapping;
  int iHeight_local;
  RtreeNode *pNode_local;
  i64 iRowid_local;
  Rtree *pRtree_local;
  
  pcVar2 = parentWrite;
  if (iHeight == 0) {
    pcVar2 = rowidWrite;
  }
  if ((0 < iHeight) && (pRVar3 = nodeHashLookup(pRtree,iRowid), pRVar3 != (RtreeNode *)0x0)) {
    nodeRelease(pRtree,pRVar3->pParent);
    nodeReference(pNode);
    pRVar3->pParent = pNode;
  }
  iVar1 = (*pcVar2)(pRtree,iRowid,pNode->iNode);
  return iVar1;
}

Assistant:

static int updateMapping(
  Rtree *pRtree, 
  i64 iRowid, 
  RtreeNode *pNode, 
  int iHeight
){
  int (*xSetMapping)(Rtree *, sqlite3_int64, sqlite3_int64);
  xSetMapping = ((iHeight==0)?rowidWrite:parentWrite);
  if( iHeight>0 ){
    RtreeNode *pChild = nodeHashLookup(pRtree, iRowid);
    if( pChild ){
      nodeRelease(pRtree, pChild->pParent);
      nodeReference(pNode);
      pChild->pParent = pNode;
    }
  }
  return xSetMapping(pRtree, iRowid, pNode->iNode);
}